

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

void loguru::signal_handler(int signal_number,siginfo_t *param_2,void *param_3)

{
  size_t __n;
  char *pcVar1;
  char *pcVar2;
  uint in_R8D;
  Message message;
  char preamble_buff [92];
  Message local_c0;
  char local_88 [104];
  
  pcVar1 = "UNKNOWN SIGNAL";
  if (signal_number == 6) {
    pcVar1 = "SIGABRT";
  }
  pcVar2 = "SIGBUS";
  if (signal_number != 7) {
    pcVar2 = pcVar1;
  }
  pcVar1 = "SIGFPE";
  if (signal_number != 8) {
    pcVar1 = pcVar2;
  }
  pcVar2 = "SIGILL";
  if (signal_number != 4) {
    pcVar2 = pcVar1;
  }
  pcVar1 = "SIGINT";
  if (signal_number != 2) {
    pcVar1 = pcVar2;
  }
  pcVar2 = "SIGSEGV";
  if (signal_number != 0xb) {
    pcVar2 = pcVar1;
  }
  pcVar1 = "SIGTERM";
  if (signal_number != 0xf) {
    pcVar1 = pcVar2;
  }
  if ((g_colorlogtostderr == '\x01') && (s_terminal_has_color == 1)) {
    write(2,"\x1b[0m",4);
    pcVar2 = "\x1b[1m";
    if (s_terminal_has_color == 0) {
      pcVar2 = "";
    }
    write(2,pcVar2,(ulong)s_terminal_has_color << 2);
    pcVar2 = "\x1b[91m";
    if ((ulong)s_terminal_has_color == 0) {
      pcVar2 = "";
    }
    write(2,pcVar2,(ulong)s_terminal_has_color * 5);
  }
  write(2,"\n",1);
  write(2,"Loguru caught a signal: ",0x18);
  __n = strlen(pcVar1);
  write(2,pcVar1,__n);
  write(2,"\n",1);
  if ((g_colorlogtostderr == '\x01') && (s_terminal_has_color == 1)) {
    write(2,"\x1b[0m",4);
  }
  if (s_signal_options == '\x01') {
    flush();
    print_preamble(local_88,0xfffffffd,0x13522d,(char *)0x0,in_R8D);
    local_c0.verbosity = -3;
    local_c0.filename = "";
    local_c0.line = 0;
    local_c0.indentation = "";
    local_c0.prefix = "Signal: ";
    local_c0.preamble = local_88;
    local_c0.message = pcVar1;
    log_message(1,&local_c0,false,false);
    flush();
  }
  call_default_signal_handler(signal_number);
  return;
}

Assistant:

void signal_handler(int signal_number, siginfo_t*, void*)
	{
		const char* signal_name = "UNKNOWN SIGNAL";

		if (signal_number == SIGABRT) { signal_name = "SIGABRT"; }
		if (signal_number == SIGBUS)  { signal_name = "SIGBUS";  }
		if (signal_number == SIGFPE)  { signal_name = "SIGFPE";  }
		if (signal_number == SIGILL)  { signal_name = "SIGILL";  }
		if (signal_number == SIGINT)  { signal_name = "SIGINT";  }
		if (signal_number == SIGSEGV) { signal_name = "SIGSEGV"; }
		if (signal_number == SIGTERM) { signal_name = "SIGTERM"; }

		// --------------------------------------------------------------------
		/* There are few things that are safe to do in a signal handler,
		   but writing to stderr is one of them.
		   So we first print out what happened to stderr so we're sure that gets out,
		   then we do the unsafe things, like logging the stack trace.
		*/

		if (g_colorlogtostderr && s_terminal_has_color) {
			write_to_stderr(terminal_reset());
			write_to_stderr(terminal_bold());
			write_to_stderr(terminal_light_red());
		}
		write_to_stderr("\n");
		write_to_stderr("Loguru caught a signal: ");
		write_to_stderr(signal_name);
		write_to_stderr("\n");
		if (g_colorlogtostderr && s_terminal_has_color) {
			write_to_stderr(terminal_reset());
		}

		// --------------------------------------------------------------------

		if (s_signal_options.unsafe_signal_handler) {
			// --------------------------------------------------------------------
			/* Now we do unsafe things. This can for example lead to deadlocks if
			   the signal was triggered from the system's memory management functions
			   and the code below tries to do allocations.
			*/

			flush();
			char preamble_buff[LOGURU_PREAMBLE_WIDTH];
			print_preamble(preamble_buff, sizeof(preamble_buff), Verbosity_FATAL, "", 0);
			auto message = Message{Verbosity_FATAL, "", 0, preamble_buff, "", "Signal: ", signal_name};
			try {
				log_message(1, message, false, false);
			} catch (...) {
				// This can happed due to s_fatal_handler.
				write_to_stderr("Exception caught and ignored by Loguru signal handler.\n");
			}
			flush();

			// --------------------------------------------------------------------
		}

		call_default_signal_handler(signal_number);
	}